

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

re_state_id __thiscall CRegexParser::alloc_state(CRegexParser *this)

{
  int iVar1;
  re_tuple_conflict *prVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = this->next_state_;
  iVar1 = this->tuples_alloc_;
  if (iVar3 < iVar1) {
    prVar2 = this->tuple_arr_;
  }
  else {
    iVar4 = (int)((long)iVar1 + 100);
    if (iVar1 == 0) {
      prVar2 = (re_tuple_conflict *)malloc((ulong)(uint)(iVar4 * 0x28));
      this->tuple_arr_ = prVar2;
    }
    else {
      prVar2 = (re_tuple_conflict *)realloc(this->tuple_arr_,((long)iVar1 + 100) * 0x28);
      this->tuple_arr_ = prVar2;
      iVar3 = this->next_state_;
    }
    this->tuples_alloc_ = iVar4;
  }
  prVar2[iVar3].next_state_1 = -1;
  this->tuple_arr_[this->next_state_].next_state_2 = -1;
  this->tuple_arr_[this->next_state_].info.ch = L'\x04';
  this->tuple_arr_[this->next_state_].flags = '\0';
  this->tuple_arr_[this->next_state_].typ = RE_INVALID;
  iVar1 = this->next_state_;
  this->next_state_ = iVar1 + 1;
  return iVar1;
}

Assistant:

re_state_id CRegexParser::alloc_state()
{
    /*
     *   If we don't have enough room for another state, expand the array 
     */
    if (next_state_ >= tuples_alloc_)
    {
        int new_alloc;
        
        /* bump the size by a bit */
        new_alloc = tuples_alloc_ + 100;
        
        /* allocate or expand the array */
        if (tuples_alloc_ == 0)
        {
            /* allocate the initial memory block */
            tuple_arr_ = (re_tuple *)t3malloc(new_alloc * sizeof(re_tuple));
        }
        else
        {
            /* re-allocate the existing memory block */
            tuple_arr_ = (re_tuple *)t3realloc(tuple_arr_,
                                               new_alloc * sizeof(re_tuple));
        }

        /* remember the new allocation size */
        tuples_alloc_ = new_alloc;
    }

    /* initialize the next state */
    tuple_arr_[next_state_].next_state_1 = RE_STATE_INVALID;
    tuple_arr_[next_state_].next_state_2 = RE_STATE_INVALID;
    tuple_arr_[next_state_].info.ch = RE_EPSILON;
    tuple_arr_[next_state_].flags = 0;
    tuple_arr_[next_state_].typ = RE_INVALID;

    /* return the new state's ID */
    return next_state_++;
}